

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

void __thiscall ON_Triangle::Flip(ON_Triangle *this,uchar edge)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_3dPoint __tmp;
  
  if (edge % 3 == 1) {
    dVar1 = this->m_V[2].z;
    dVar2 = this->m_V[2].x;
    dVar3 = this->m_V[2].y;
    dVar4 = this->m_V[0].y;
    this->m_V[2].x = this->m_V[0].x;
    this->m_V[2].y = dVar4;
    this->m_V[2].z = this->m_V[0].z;
    this->m_V[0].x = dVar2;
    this->m_V[0].y = dVar3;
    this->m_V[0].z = dVar1;
    return;
  }
  if (edge % 3 == 0) {
    dVar1 = this->m_V[1].z;
    dVar2 = this->m_V[1].x;
    dVar3 = this->m_V[1].y;
    dVar4 = this->m_V[2].y;
    this->m_V[1].x = this->m_V[2].x;
    this->m_V[1].y = dVar4;
    this->m_V[1].z = this->m_V[2].z;
    this->m_V[2].x = dVar2;
    this->m_V[2].y = dVar3;
    this->m_V[2].z = dVar1;
    return;
  }
  dVar1 = this->m_V[0].z;
  dVar2 = this->m_V[0].x;
  dVar3 = this->m_V[0].y;
  dVar4 = this->m_V[1].y;
  this->m_V[0].x = this->m_V[1].x;
  this->m_V[0].y = dVar4;
  this->m_V[0].z = this->m_V[1].z;
  this->m_V[1].x = dVar2;
  this->m_V[1].y = dVar3;
  this->m_V[1].z = dVar1;
  return;
}

Assistant:

void ON_Triangle::Flip(unsigned char edge)
{
  switch (edge % 3)
  {
  case 0:
    std::swap(m_V[1], m_V[2]);
    break;
  case 1:
    std::swap(m_V[2], m_V[0]);
    break;
  default: //2
    std::swap(m_V[0], m_V[1]);
    break;
  }
}